

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void cmyk_ycck_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                      JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  _func_void_j_compress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  JSAMPIMAGE pppJVar10;
  uint local_74;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr3;
  JSAMPROW outptr2;
  JSAMPROW outptr1;
  JSAMPROW outptr0;
  JSAMPROW inptr;
  INT32 *ctab;
  int b;
  int g;
  int r;
  my_cconvert_ptr_conflict cconvert;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  p_Var2 = cinfo->cconvert[1].start_pass;
  uVar1 = cinfo->image_width;
  cconvert._0_4_ = num_rows;
  cconvert._4_4_ = output_row;
  output_buf_local = (JSAMPIMAGE)input_buf;
  while (cconvert._0_4_ = (int)cconvert + -1, -1 < (int)cconvert) {
    pppJVar10 = output_buf_local + 1;
    outptr0 = (JSAMPROW)*output_buf_local;
    pJVar3 = (*output_buf)[cconvert._4_4_];
    pJVar4 = output_buf[1][cconvert._4_4_];
    pJVar5 = output_buf[2][cconvert._4_4_];
    pJVar6 = output_buf[3][cconvert._4_4_];
    cconvert._4_4_ = cconvert._4_4_ + 1;
    for (local_74 = 0; output_buf_local = pppJVar10, local_74 < uVar1; local_74 = local_74 + 1) {
      iVar7 = -(uint)*outptr0;
      iVar8 = -(uint)outptr0[1];
      iVar9 = -(uint)outptr0[2];
      pJVar6[local_74] = outptr0[3];
      outptr0 = outptr0 + 4;
      pJVar3[local_74] =
           (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(iVar7 + 0xff) * 8) +
                             *(long *)(p_Var2 + (long)(iVar8 + 0x1ff) * 8) +
                            *(long *)(p_Var2 + (long)(iVar9 + 0x2ff) * 8)) >> 0x10);
      pJVar4[local_74] =
           (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(iVar7 + 0x3ff) * 8) +
                             *(long *)(p_Var2 + (long)(iVar8 + 0x4ff) * 8) +
                            *(long *)(p_Var2 + (long)(iVar9 + 0x5ff) * 8)) >> 0x10);
      pJVar5[local_74] =
           (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(iVar7 + 0x5ff) * 8) +
                             *(long *)(p_Var2 + (long)(iVar8 + 0x6ff) * 8) +
                            *(long *)(p_Var2 + (long)(iVar9 + 0x7ff) * 8)) >> 0x10);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
cmyk_ycck_convert (j_compress_ptr cinfo,
		   JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		   JDIMENSION output_row, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_ycc_tab;
  register JSAMPROW inptr;
  register JSAMPROW outptr0, outptr1, outptr2, outptr3;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr0 = output_buf[0][output_row];
    outptr1 = output_buf[1][output_row];
    outptr2 = output_buf[2][output_row];
    outptr3 = output_buf[3][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      r = MAXJSAMPLE - GETJSAMPLE(inptr[0]);
      g = MAXJSAMPLE - GETJSAMPLE(inptr[1]);
      b = MAXJSAMPLE - GETJSAMPLE(inptr[2]);
      /* K passes through as-is */
      outptr3[col] = inptr[3];	/* don't need GETJSAMPLE here */
      inptr += 4;
      /* If the inputs are 0..MAXJSAMPLE, the outputs of these equations
       * must be too; we do not need an explicit range-limiting operation.
       * Hence the value being shifted is never negative, and we don't
       * need the general RIGHT_SHIFT macro.
       */
      /* Y */
      outptr0[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
      /* Cb */
      outptr1[col] = (JSAMPLE)
		((ctab[r+R_CB_OFF] + ctab[g+G_CB_OFF] + ctab[b+B_CB_OFF])
		 >> SCALEBITS);
      /* Cr */
      outptr2[col] = (JSAMPLE)
		((ctab[r+R_CR_OFF] + ctab[g+G_CR_OFF] + ctab[b+B_CR_OFF])
		 >> SCALEBITS);
    }
  }
}